

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagholder.cpp
# Opt level: O3

Value * __thiscall camp::TagHolder::tagId(TagHolder *this,size_t index)

{
  _Rb_tree_node_base *p_Var1;
  OutOfRange *__return_storage_ptr__;
  string local_b0;
  string local_90;
  OutOfRange local_70;
  
  if ((this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_node_count <= index) {
    __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
    OutOfRange::OutOfRange
              (&local_70,index,(this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/tagholder.cpp"
               ,"");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"const Value &camp::TagHolder::tagId(std::size_t) const","");
    Error::prepare<camp::OutOfRange>(__return_storage_ptr__,&local_70,&local_b0,0x37,&local_90);
    __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,Error::~Error);
  }
  p_Var1 = (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((long)index < 1) {
    if (index != 0) {
      do {
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var1);
        index = index + 1;
      } while (index != 0);
    }
  }
  else {
    do {
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
      index = index - 1;
    } while (index != 0);
  }
  return (Value *)(p_Var1 + 1);
}

Assistant:

const Value& TagHolder::tagId(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_tags.size())
        CAMP_ERROR(OutOfRange(index, m_tags.size()));

    TagsTable::const_iterator it = m_tags.begin();
    std::advance(it, index);

    return it->first;
}